

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

bool __thiscall Player::travel(Player *this,string *direction)

{
  RoomID *__k;
  Map *this_00;
  mapped_type *pmVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  
  this_00 = &this->map;
  __k = &this->currentLocation;
  pmVar1 = std::__detail::
           _Map_base<int,_std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<int,_std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this_00,__k);
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(((pmVar1->_M_t).super___uniq_ptr_impl<Room,_std::default_delete<Room>_>._M_t.
                    super__Tuple_impl<0UL,_Room_*,_std::default_delete<Room>_>.
                    super__Head_base<0UL,_Room_*,_false>._M_head_impl)->exits)._M_h,direction);
  std::__detail::
  _Map_base<int,_std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  ::at((_Map_base<int,_std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        *)this_00,__k);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur != (__node_type *)0x0) {
    pmVar1 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<int,_std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this_00,__k);
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&((pmVar1->_M_t).
                               super___uniq_ptr_impl<Room,_std::default_delete<Room>_>._M_t.
                               super__Tuple_impl<0UL,_Room_*,_std::default_delete<Room>_>.
                               super__Head_base<0UL,_Room_*,_false>._M_head_impl)->exits,direction);
    this->currentLocation = *pmVar3;
    look(this);
  }
  return iVar2.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool Player::travel(std::string direction)
{
  if (map.rooms.at(currentLocation)->exits.find(direction) == map.rooms.at(currentLocation)->exits.end())
    return false;
  currentLocation = map.rooms.at(currentLocation)->exits[direction];
  look();
  return true;
}